

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopl_file.c
# Opt level: O1

void WOPL_writeInstrument
               (WOPLInstrument *ins,uint8_t *cursor,uint16_t version,uint8_t has_sounding_delays)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  
  uVar1 = *(undefined8 *)ins->inst_name;
  uVar2 = *(undefined8 *)(ins->inst_name + 8);
  uVar3 = *(undefined8 *)(ins->inst_name + 0x18);
  *(undefined8 *)(cursor + 0x10) = *(undefined8 *)(ins->inst_name + 0x10);
  *(undefined8 *)(cursor + 0x18) = uVar3;
  *(undefined8 *)cursor = uVar1;
  *(undefined8 *)(cursor + 8) = uVar2;
  cursor[0x20] = '\0';
  *(ushort *)(cursor + 0x20) = ins->note_offset1 << 8 | (ushort)ins->note_offset1 >> 8;
  *(ushort *)(cursor + 0x22) = ins->note_offset2 << 8 | (ushort)ins->note_offset2 >> 8;
  cursor[0x24] = ins->midi_velocity_offset;
  cursor[0x25] = ins->second_voice_detune;
  cursor[0x26] = ins->percussion_key_number;
  cursor[0x27] = ins->inst_flags;
  cursor[0x28] = ins->fb_conn1_C0;
  cursor[0x29] = ins->fb_conn2_C0;
  lVar4 = 0;
  do {
    cursor[lVar4 + 0x2a] = (&ins->operators[0].avekf_20)[lVar4];
    cursor[lVar4 + 0x2b] = (&ins->operators[0].ksl_l_40)[lVar4];
    cursor[lVar4 + 0x2c] = (&ins->operators[0].atdec_60)[lVar4];
    cursor[lVar4 + 0x2d] = (&ins->operators[0].susrel_80)[lVar4];
    cursor[lVar4 + 0x2e] = (&ins->operators[0].waveform_E0)[lVar4];
    lVar4 = lVar4 + 5;
  } while (lVar4 != 0x14);
  if (has_sounding_delays != '\0' && 2 < version) {
    *(uint16_t *)(cursor + 0x3e) = ins->delay_on_ms << 8 | ins->delay_on_ms >> 8;
    *(uint16_t *)(cursor + 0x40) = ins->delay_off_ms << 8 | ins->delay_off_ms >> 8;
  }
  return;
}

Assistant:

static void WOPL_writeInstrument(WOPLInstrument *ins, uint8_t *cursor, uint16_t version, uint8_t has_sounding_delays)
{
    int l;
    memcpy((char*)cursor, ins->inst_name, 32);
    cursor[32] = '\0';
    fromSint16BE(ins->note_offset1, cursor + 32);
    fromSint16BE(ins->note_offset2, cursor + 34);
    cursor[36] = (uint8_t)ins->midi_velocity_offset;
    cursor[37] = (uint8_t)ins->second_voice_detune;
    cursor[38] = ins->percussion_key_number;
    cursor[39] = ins->inst_flags;
    cursor[40] = ins->fb_conn1_C0;
    cursor[41] = ins->fb_conn2_C0;
    for(l = 0; l < 4; l++)
    {
        size_t off = 42 + (size_t)(l) * 5;
        cursor[off + 0] = ins->operators[l].avekf_20;
        cursor[off + 1] = ins->operators[l].ksl_l_40;
        cursor[off + 2] = ins->operators[l].atdec_60;
        cursor[off + 3] = ins->operators[l].susrel_80;
        cursor[off + 4] = ins->operators[l].waveform_E0;
    }
    if((version >= 3) && has_sounding_delays)
    {
        fromUint16BE(ins->delay_on_ms, cursor + 62);
        fromUint16BE(ins->delay_off_ms, cursor + 64);
    }
}